

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUnate.c
# Opt level: O1

Vec_Wec_t * Gia_ManCheckUnateVec(Gia_Man_t *p,Vec_Int_t *vCiIds,Vec_Int_t *vCoIds)

{
  uint *puVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  Gia_Obj_t *pGVar6;
  void *pvVar7;
  uint *__ptr;
  Vec_Wec_t *pVVar8;
  Vec_Int_t *pVVar9;
  int *__ptr_00;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  size_t __size;
  int *piVar19;
  uint uVar20;
  int *piVar21;
  int *piVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  uint *local_58;
  
  if (vCiIds == (Vec_Int_t *)0x0) {
    uVar15 = p->vCis->nSize;
    local_58 = (uint *)malloc(0x10);
    uVar20 = 0x10;
    if (0xe < uVar15 - 1) {
      uVar20 = uVar15;
    }
    local_58[1] = 0;
    *local_58 = uVar20;
    if (uVar20 == 0) {
      pvVar7 = (void *)0x0;
    }
    else {
      pvVar7 = malloc((long)(int)uVar20 << 2);
    }
    *(void **)(local_58 + 2) = pvVar7;
    local_58[1] = uVar15;
    if (0 < (int)uVar15) {
      uVar11 = 0;
      do {
        *(int *)((long)pvVar7 + uVar11 * 4) = (int)uVar11;
        uVar11 = uVar11 + 1;
      } while (uVar15 != uVar11);
    }
  }
  else {
    local_58 = (uint *)malloc(0x10);
    uVar15 = vCiIds->nSize;
    lVar24 = (long)(int)uVar15;
    local_58[1] = uVar15;
    *local_58 = uVar15;
    if (lVar24 == 0) {
      pvVar7 = (void *)0x0;
    }
    else {
      pvVar7 = malloc(lVar24 * 4);
    }
    *(void **)(local_58 + 2) = pvVar7;
    memcpy(pvVar7,vCiIds->pArray,lVar24 << 2);
  }
  if (vCoIds == (Vec_Int_t *)0x0) {
    uVar15 = p->vCos->nSize;
    __ptr = (uint *)malloc(0x10);
    uVar20 = 0x10;
    if (0xe < uVar15 - 1) {
      uVar20 = uVar15;
    }
    __ptr[1] = 0;
    *__ptr = uVar20;
    if (uVar20 == 0) {
      pvVar7 = (void *)0x0;
    }
    else {
      pvVar7 = malloc((long)(int)uVar20 << 2);
    }
    *(void **)(__ptr + 2) = pvVar7;
    __ptr[1] = uVar15;
    if (0 < (int)uVar15) {
      uVar11 = 0;
      do {
        *(int *)((long)pvVar7 + uVar11 * 4) = (int)uVar11;
        uVar11 = uVar11 + 1;
      } while (uVar15 != uVar11);
    }
  }
  else {
    __ptr = (uint *)malloc(0x10);
    uVar15 = vCoIds->nSize;
    lVar24 = (long)(int)uVar15;
    __ptr[1] = uVar15;
    *__ptr = uVar15;
    if (lVar24 == 0) {
      pvVar7 = (void *)0x0;
    }
    else {
      pvVar7 = malloc(lVar24 * 4);
    }
    *(void **)(__ptr + 2) = pvVar7;
    memcpy(pvVar7,vCoIds->pArray,lVar24 << 2);
  }
  uVar15 = __ptr[1];
  pVVar8 = (Vec_Wec_t *)malloc(0x10);
  uVar20 = uVar15;
  if (uVar15 - 1 < 7) {
    uVar20 = 8;
  }
  pVVar8->nSize = 0;
  pVVar8->nCap = uVar20;
  if (uVar20 == 0) {
    pVVar9 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar9 = (Vec_Int_t *)calloc((long)(int)uVar20,0x10);
  }
  pVVar8->pArray = pVVar9;
  pVVar8->nSize = uVar15;
  iVar18 = p->nObjs;
  __ptr_00 = (int *)malloc(0x10);
  iVar13 = 8;
  if (6 < iVar18 - 1U) {
    iVar13 = iVar18;
  }
  __ptr_00[1] = 0;
  *__ptr_00 = iVar13;
  if (iVar13 == 0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pvVar7 = calloc((long)iVar13,0x10);
  }
  *(void **)(__ptr_00 + 2) = pvVar7;
  __ptr_00[1] = iVar18;
  if (0 < (int)local_58[1]) {
    lVar24 = 0;
    do {
      iVar13 = *(int *)(*(long *)(local_58 + 2) + lVar24 * 4);
      if (((long)iVar13 < 0) || (p->vCis->nSize <= iVar13)) goto LAB_007cd1f3;
      iVar16 = p->vCis->pArray[iVar13];
      if (((long)iVar16 < 0) || (p->nObjs <= iVar16)) goto LAB_007cd1d4;
      if (iVar18 <= iVar16) goto LAB_007cd1b5;
      Vec_IntPush((Vec_Int_t *)((long)iVar16 * 0x10 + (long)pvVar7),iVar13 * 2);
      lVar24 = lVar24 + 1;
    } while (lVar24 < (int)local_58[1]);
  }
  if (0 < p->nObjs) {
    lVar24 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar6 = p->pObjs + lVar24;
      uVar15 = (uint)*(ulong *)pGVar6;
      if ((~uVar15 & 0x1fffffff) != 0 && -1 < (int)uVar15) {
        uVar20 = (int)lVar24 - (uVar15 & 0x1fffffff);
        if ((int)uVar20 < 0) goto LAB_007cd1b5;
        iVar18 = __ptr_00[1];
        if (((iVar18 <= (int)uVar20) ||
            (uVar12 = (int)lVar24 - ((uint)(*(ulong *)pGVar6 >> 0x20) & 0x1fffffff), (int)uVar12 < 0
            )) || (iVar18 <= (int)uVar12)) goto LAB_007cd1b5;
        lVar10 = *(long *)(__ptr_00 + 2);
        lVar14 = (ulong)uVar20 * 0x10 + lVar10;
        if (((uVar15 >> 0x1d & 1) != 0) && (iVar13 = *(int *)(lVar14 + 4), 0 < iVar13)) {
          iVar16 = 0;
          do {
            iVar17 = iVar16 + 1;
            if (iVar17 < iVar13) {
              uVar15 = *(uint *)(*(long *)(lVar14 + 8) + (long)iVar16 * 4);
              if (((int)uVar15 < 0) ||
                 (uVar20 = *(uint *)(*(long *)(lVar14 + 8) + (long)iVar17 * 4), (int)uVar20 < 0))
              goto LAB_007cd196;
              if (1 < (uVar20 ^ uVar15)) goto LAB_007cccda;
            }
            else {
LAB_007cccda:
              puVar1 = (uint *)(*(long *)(lVar14 + 8) + (long)iVar16 * 4);
              *puVar1 = *puVar1 ^ 1;
              iVar17 = iVar16;
            }
            iVar16 = iVar17 + 1;
            iVar13 = *(int *)(lVar14 + 4);
          } while (iVar16 < iVar13);
        }
        lVar25 = (ulong)uVar12 * 0x10 + lVar10;
        if ((((undefined1  [12])*pGVar6 & (undefined1  [12])0x2000000000000000) !=
             (undefined1  [12])0x0) && (iVar13 = *(int *)(lVar25 + 4), 0 < iVar13)) {
          iVar16 = 0;
          do {
            iVar17 = iVar16 + 1;
            if (iVar17 < iVar13) {
              uVar15 = *(uint *)(*(long *)(lVar25 + 8) + (long)iVar16 * 4);
              if (((int)uVar15 < 0) ||
                 (uVar20 = *(uint *)(*(long *)(lVar25 + 8) + (long)iVar17 * 4), (int)uVar20 < 0))
              goto LAB_007cd196;
              if (1 < (uVar20 ^ uVar15)) goto LAB_007ccd42;
            }
            else {
LAB_007ccd42:
              puVar1 = (uint *)(*(long *)(lVar25 + 8) + (long)iVar16 * 4);
              *puVar1 = *puVar1 ^ 1;
              iVar17 = iVar16;
            }
            iVar16 = iVar17 + 1;
            iVar13 = *(int *)(lVar25 + 4);
          } while (iVar16 < iVar13);
        }
        if (iVar18 <= lVar24) goto LAB_007cd1b5;
        piVar2 = (int *)(lVar10 + lVar24 * 0x10);
        lVar23 = (long)*(int *)(lVar25 + 4) + (long)*(int *)(lVar14 + 4);
        iVar18 = (int)lVar23;
        if (*(int *)(lVar10 + lVar24 * 0x10) < iVar18) {
          __size = lVar23 * 4;
          if (*(void **)(piVar2 + 2) == (void *)0x0) {
            pvVar7 = malloc(__size);
          }
          else {
            pvVar7 = realloc(*(void **)(piVar2 + 2),__size);
          }
          *(void **)(piVar2 + 2) = pvVar7;
          if (pvVar7 == (void *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          *piVar2 = iVar18;
        }
        piVar3 = *(int **)(piVar2 + 2);
        piVar4 = *(int **)(lVar14 + 8);
        piVar5 = *(int **)(lVar25 + 8);
        iVar18 = *(int *)(lVar14 + 4);
        iVar13 = *(int *)(lVar25 + 4);
        piVar19 = piVar3;
        piVar22 = piVar4;
        piVar21 = piVar5;
        if ((0 < (long)iVar18) && (0 < iVar13)) {
          do {
            iVar16 = *piVar22;
            iVar17 = *piVar21;
            if (iVar16 == iVar17) {
              piVar22 = piVar22 + 1;
              *piVar19 = iVar16;
              piVar21 = piVar21 + 1;
            }
            else if (iVar16 < iVar17) {
              piVar22 = piVar22 + 1;
              *piVar19 = iVar16;
            }
            else {
              piVar21 = piVar21 + 1;
              *piVar19 = iVar17;
            }
            piVar19 = piVar19 + 1;
          } while ((piVar22 < piVar4 + iVar18) && (piVar21 < piVar5 + iVar13));
        }
        for (; piVar22 < piVar4 + iVar18; piVar22 = piVar22 + 1) {
          *piVar19 = *piVar22;
          piVar19 = piVar19 + 1;
        }
        for (; piVar21 < piVar5 + iVar13; piVar21 = piVar21 + 1) {
          *piVar19 = *piVar21;
          piVar19 = piVar19 + 1;
        }
        iVar18 = (int)((ulong)((long)piVar19 - (long)piVar3) >> 2);
        piVar2[1] = iVar18;
        if (*piVar2 < iVar18) {
          __assert_fail("vArr->nSize <= vArr->nCap",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x72c,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
        }
        iVar13 = *(int *)(lVar14 + 4);
        if (iVar18 < iVar13) {
          __assert_fail("vArr->nSize >= vArr1->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x72d,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
        }
        if (iVar18 < *(int *)(lVar25 + 4)) {
          __assert_fail("vArr->nSize >= vArr2->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x72e,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
        }
        if ((0 < iVar13) &&
           (((undefined1  [12])*pGVar6 & (undefined1  [12])0x20000000) != (undefined1  [12])0x0)) {
          iVar18 = 0;
          do {
            iVar16 = iVar18 + 1;
            if (iVar16 < iVar13) {
              if ((piVar4[iVar18] < 0) || (piVar4[iVar16] < 0)) goto LAB_007cd196;
              if (1 < (uint)(piVar4[iVar16] ^ piVar4[iVar18])) goto LAB_007ccece;
            }
            else {
LAB_007ccece:
              *(byte *)(piVar4 + iVar18) = *(byte *)(piVar4 + iVar18) ^ 1;
              iVar16 = iVar18;
            }
            iVar18 = iVar16 + 1;
            iVar13 = *(int *)(lVar14 + 4);
          } while (iVar18 < iVar13);
        }
        if ((((undefined1  [12])*pGVar6 & (undefined1  [12])0x2000000000000000) !=
             (undefined1  [12])0x0) && (iVar18 = *(int *)(lVar25 + 4), 0 < iVar18)) {
          iVar13 = 0;
          do {
            iVar16 = iVar13 + 1;
            if (iVar16 < iVar18) {
              if ((piVar5[iVar13] < 0) || (piVar5[iVar16] < 0)) goto LAB_007cd196;
              if (1 < (uint)(piVar5[iVar16] ^ piVar5[iVar13])) goto LAB_007ccf1d;
            }
            else {
LAB_007ccf1d:
              *(byte *)(piVar5 + iVar13) = *(byte *)(piVar5 + iVar13) ^ 1;
              iVar16 = iVar13;
            }
            iVar13 = iVar16 + 1;
            iVar18 = *(int *)(lVar25 + 4);
          } while (iVar13 < iVar18);
        }
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 < p->nObjs);
  }
  if (0 < (int)__ptr[1]) {
    lVar24 = 0;
    do {
      iVar18 = *(int *)(*(long *)(__ptr + 2) + lVar24 * 4);
      if (((long)iVar18 < 0) || (p->vCos->nSize <= iVar18)) {
LAB_007cd1f3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar18 = p->vCos->pArray[iVar18];
      lVar10 = (long)iVar18;
      if ((lVar10 < 0) || (p->nObjs <= iVar18)) {
LAB_007cd1d4:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar6 = p->pObjs;
      uVar15 = *(uint *)(pGVar6 + lVar10);
      uVar20 = iVar18 - (uVar15 & 0x1fffffff);
      if (((int)uVar20 < 0) || (__ptr_00[1] <= (int)uVar20)) {
LAB_007cd1b5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      lVar14 = (ulong)uVar20 * 0x10 + *(long *)(__ptr_00 + 2);
      if (((uVar15 >> 0x1d & 1) != 0) && (iVar18 = *(int *)(lVar14 + 4), 0 < iVar18)) {
        iVar13 = 0;
        do {
          iVar16 = iVar13 + 1;
          if (iVar16 < iVar18) {
            uVar15 = *(uint *)(*(long *)(lVar14 + 8) + (long)iVar13 * 4);
            if (((int)uVar15 < 0) ||
               (uVar20 = *(uint *)(*(long *)(lVar14 + 8) + (long)iVar16 * 4), (int)uVar20 < 0))
            goto LAB_007cd196;
            if (1 < (uVar20 ^ uVar15)) goto LAB_007cd000;
          }
          else {
LAB_007cd000:
            puVar1 = (uint *)(*(long *)(lVar14 + 8) + (long)iVar13 * 4);
            *puVar1 = *puVar1 ^ 1;
            iVar16 = iVar13;
          }
          iVar13 = iVar16 + 1;
          iVar18 = *(int *)(lVar14 + 4);
        } while (iVar13 < iVar18);
      }
      if (pVVar8->nSize <= lVar24) goto LAB_007cd1b5;
      if (0 < *(int *)(lVar14 + 4)) {
        pVVar9 = pVVar8->pArray;
        lVar25 = 0;
        do {
          Vec_IntPush(pVVar9 + lVar24,*(int *)(*(long *)(lVar14 + 8) + lVar25 * 4));
          lVar25 = lVar25 + 1;
        } while (lVar25 < *(int *)(lVar14 + 4));
      }
      if (((pGVar6[lVar10].field_0x3 & 0x20) != 0) && (iVar18 = *(int *)(lVar14 + 4), 0 < iVar18)) {
        iVar13 = 0;
        do {
          iVar16 = iVar13 + 1;
          if (iVar16 < iVar18) {
            uVar15 = *(uint *)(*(long *)(lVar14 + 8) + (long)iVar13 * 4);
            if (((int)uVar15 < 0) ||
               (uVar20 = *(uint *)(*(long *)(lVar14 + 8) + (long)iVar16 * 4), (int)uVar20 < 0)) {
LAB_007cd196:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            if (1 < (uVar20 ^ uVar15)) goto LAB_007cd0ab;
          }
          else {
LAB_007cd0ab:
            puVar1 = (uint *)(*(long *)(lVar14 + 8) + (long)iVar13 * 4);
            *puVar1 = *puVar1 ^ 1;
            iVar16 = iVar13;
          }
          iVar13 = iVar16 + 1;
          iVar18 = *(int *)(lVar14 + 4);
        } while (iVar13 < iVar18);
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 < (int)__ptr[1]);
  }
  iVar18 = *__ptr_00;
  if (0 < (long)iVar18) {
    lVar24 = *(long *)(__ptr_00 + 2);
    lVar10 = 0;
    do {
      pvVar7 = *(void **)(lVar24 + 8 + lVar10);
      if (pvVar7 != (void *)0x0) {
        free(pvVar7);
        *(undefined8 *)(lVar24 + 8 + lVar10) = 0;
      }
      lVar10 = lVar10 + 0x10;
    } while ((long)iVar18 * 0x10 != lVar10);
  }
  if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_00 + 2));
    __ptr_00[2] = 0;
    __ptr_00[3] = 0;
  }
  __ptr_00[0] = 0;
  __ptr_00[1] = 0;
  free(__ptr_00);
  if (*(void **)(local_58 + 2) != (void *)0x0) {
    free(*(void **)(local_58 + 2));
    local_58[2] = 0;
    local_58[3] = 0;
  }
  free(local_58);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return pVVar8;
}

Assistant:

Vec_Wec_t * Gia_ManCheckUnateVec( Gia_Man_t * p, Vec_Int_t * vCiIds, Vec_Int_t * vCoIds )
{
    Vec_Int_t * vCiVec = vCiIds ? Vec_IntDup(vCiIds) : Vec_IntStartNatural(Gia_ManCiNum(p));
    Vec_Int_t * vCoVec = vCoIds ? Vec_IntDup(vCoIds) : Vec_IntStartNatural(Gia_ManCoNum(p));
    Vec_Wec_t * vUnatesCo = Vec_WecStart( Vec_IntSize(vCoVec) );
    Vec_Wec_t * vUnates   = Vec_WecStart( Gia_ManObjNum(p) );
    Vec_Int_t * vUnate0, * vUnate1;
    Gia_Obj_t * pObj; int i, CioId;
    Vec_IntForEachEntry( vCiVec, CioId, i )
    {
        pObj = Gia_ManCi( p, CioId );
        Vec_IntPush( Vec_WecEntry(vUnates, Gia_ObjId(p, pObj)), Abc_Var2Lit(CioId, 0) );
    }
    Gia_ManForEachAnd( p, pObj, i )
    {
        vUnate0 = Vec_WecEntry(vUnates, Gia_ObjFaninId0(pObj, i));
        vUnate1 = Vec_WecEntry(vUnates, Gia_ObjFaninId1(pObj, i));
        vUnate0 = Gia_ObjFaninC0(pObj) ? Vec_IntFlopBit(vUnate0) : vUnate0;
        vUnate1 = Gia_ObjFaninC1(pObj) ? Vec_IntFlopBit(vUnate1) : vUnate1;
        Vec_IntTwoMerge2( vUnate0, vUnate1, Vec_WecEntry(vUnates, i) ); 
        vUnate0 = Gia_ObjFaninC0(pObj) ? Vec_IntFlopBit(vUnate0) : vUnate0;
        vUnate1 = Gia_ObjFaninC1(pObj) ? Vec_IntFlopBit(vUnate1) : vUnate1;
    }
    Vec_IntForEachEntry( vCoVec, CioId, i )
    {
        pObj    = Gia_ManCo( p, CioId );
        vUnate0 = Vec_WecEntry(vUnates, Gia_ObjFaninId0p(p, pObj));
        vUnate0 = Gia_ObjFaninC0(pObj) ? Vec_IntFlopBit(vUnate0) : vUnate0;
        Vec_IntAppend( Vec_WecEntry(vUnatesCo, i), vUnate0 );
        vUnate0 = Gia_ObjFaninC0(pObj) ? Vec_IntFlopBit(vUnate0) : vUnate0;
    }
    Vec_WecFree( vUnates );
    Vec_IntFree( vCiVec );
    Vec_IntFree( vCoVec );
    return vUnatesCo;
}